

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O3

void sys_rename(Process *proc,Args *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  path dst;
  path src;
  path local_a0;
  string local_80;
  string local_60;
  path local_40;
  
  ReadString_abi_cxx11_(&local_80,(pid_t)args->PID,args->Arg[0]);
  paVar1 = &local_a0.m_pathname.field_2;
  local_a0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length);
  Process::Normalise(&local_40,proc,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_pathname._M_dataplus._M_p,
                    local_a0.m_pathname.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  ReadString_abi_cxx11_(&local_60,(pid_t)args->PID,args->Arg[1]);
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  Process::Normalise(&local_a0,proc,(path *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (-1 < args->Return) {
    Process::Rename(proc,&local_40,&local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_pathname._M_dataplus._M_p,
                    local_a0.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_pathname._M_dataplus._M_p != &local_40.m_pathname.field_2) {
    operator_delete(local_40.m_pathname._M_dataplus._M_p,
                    local_40.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void sys_rename(Process *proc, const Args &args)
{
  const fs::path src = proc->Normalise(ReadString(args.PID, args[0]));
  const fs::path dst = proc->Normalise(ReadString(args.PID, args[1]));

  if (args.Return >= 0) {
    proc->Rename(src, dst);
  }
}